

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O2

void jpeg_fdct_4x4(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  
  memset(data,0,0x100);
  uVar4 = (ulong)start_col;
  for (lVar11 = 0; lVar11 != 0x20; lVar11 = lVar11 + 8) {
    lVar5 = *(long *)((long)sample_data + lVar11);
    bVar1 = *(byte *)(lVar5 + 3 + uVar4);
    iVar8 = (uint)*(byte *)(lVar5 + uVar4) + (uint)bVar1;
    bVar2 = *(byte *)(lVar5 + 1 + uVar4);
    bVar3 = *(byte *)(lVar5 + 2 + uVar4);
    iVar9 = (uint)bVar2 + (uint)bVar3;
    lVar6 = (ulong)*(byte *)(lVar5 + uVar4) - (ulong)bVar1;
    lVar5 = (ulong)bVar2 - (ulong)bVar3;
    data[lVar11] = (iVar9 + iVar8) * 0x10 + -0x2000;
    data[lVar11 + 2] = (iVar8 - iVar9) * 0x10;
    lVar7 = (lVar5 + lVar6) * 0x1151;
    data[lVar11 + 1] = (DCTELEM)(lVar6 * 0x187e + lVar7 + 0x100U >> 9);
    data[lVar11 + 3] = (DCTELEM)(lVar5 * 0x1ffffffc4df + lVar7 + 0x100U >> 9);
  }
  for (lVar11 = 0; (int)lVar11 != 4; lVar11 = lVar11 + 1) {
    lVar7 = (long)(data[lVar11 + 0x18] + data[lVar11]);
    lVar10 = (long)(data[lVar11 + 0x10] + data[lVar11 + 8]);
    lVar5 = (long)(data[lVar11] - data[lVar11 + 0x18]);
    lVar6 = (long)(data[lVar11 + 8] - data[lVar11 + 0x10]);
    data[lVar11] = (DCTELEM)(lVar7 + lVar10 + 2U >> 2);
    data[lVar11 + 0x10] = (DCTELEM)((ulong)((lVar7 + 2) - lVar10) >> 2);
    lVar7 = (lVar6 + lVar5) * 0x1151;
    data[lVar11 + 8] = (DCTELEM)(lVar5 * 0x187e + lVar7 + 0x4000U >> 0xf);
    data[lVar11 + 0x18] = (DCTELEM)(lVar7 + lVar6 * 0x7fffffffc4df + 0x4000U >> 0xf);
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_fdct_4x4 (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  INT32 tmp0, tmp1;
  INT32 tmp10, tmp11;
  DCTELEM *dataptr;
  JSAMPROW elemptr;
  int ctr;
  SHIFT_TEMPS

  /* Pre-zero output coefficient block. */
  MEMZERO(data, SIZEOF(DCTELEM) * DCTSIZE2);

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT; */
  /* furthermore, we scale the results by 2**PASS1_BITS. */
  /* We must also scale the output by (8/4)**2 = 2**2, which we add here. */
  /* cK represents sqrt(2) * cos(K*pi/16) [refers to 8-point FDCT]. */

  dataptr = data;
  for (ctr = 0; ctr < 4; ctr++) {
    elemptr = sample_data[ctr] + start_col;

    /* Even part */

    tmp0 = GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[3]);
    tmp1 = GETJSAMPLE(elemptr[1]) + GETJSAMPLE(elemptr[2]);

    tmp10 = GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[3]);
    tmp11 = GETJSAMPLE(elemptr[1]) - GETJSAMPLE(elemptr[2]);

    /* Apply unsigned->signed conversion */
    dataptr[0] = (DCTELEM)
      ((tmp0 + tmp1 - 4 * CENTERJSAMPLE) << (PASS1_BITS+2));
    dataptr[2] = (DCTELEM) ((tmp0 - tmp1) << (PASS1_BITS+2));

    /* Odd part */

    tmp0 = MULTIPLY(tmp10 + tmp11, FIX_0_541196100);       /* c6 */
    /* Add fudge factor here for final descale. */
    tmp0 += ONE << (CONST_BITS-PASS1_BITS-3);

    dataptr[1] = (DCTELEM)
      RIGHT_SHIFT(tmp0 + MULTIPLY(tmp10, FIX_0_765366865), /* c2-c6 */
		  CONST_BITS-PASS1_BITS-2);
    dataptr[3] = (DCTELEM)
      RIGHT_SHIFT(tmp0 - MULTIPLY(tmp11, FIX_1_847759065), /* c2+c6 */
		  CONST_BITS-PASS1_BITS-2);

    dataptr += DCTSIZE;		/* advance pointer to next row */
  }

  /* Pass 2: process columns.
   * We remove the PASS1_BITS scaling, but leave the results scaled up
   * by an overall factor of 8.
   */

  dataptr = data;
  for (ctr = 0; ctr < 4; ctr++) {
    /* Even part */

    /* Add fudge factor here for final descale. */
    tmp0 = dataptr[DCTSIZE*0] + dataptr[DCTSIZE*3] + (ONE << (PASS1_BITS-1));
    tmp1 = dataptr[DCTSIZE*1] + dataptr[DCTSIZE*2];

    tmp10 = dataptr[DCTSIZE*0] - dataptr[DCTSIZE*3];
    tmp11 = dataptr[DCTSIZE*1] - dataptr[DCTSIZE*2];

    dataptr[DCTSIZE*0] = (DCTELEM) RIGHT_SHIFT(tmp0 + tmp1, PASS1_BITS);
    dataptr[DCTSIZE*2] = (DCTELEM) RIGHT_SHIFT(tmp0 - tmp1, PASS1_BITS);

    /* Odd part */

    tmp0 = MULTIPLY(tmp10 + tmp11, FIX_0_541196100);       /* c6 */
    /* Add fudge factor here for final descale. */
    tmp0 += ONE << (CONST_BITS+PASS1_BITS-1);

    dataptr[DCTSIZE*1] = (DCTELEM)
      RIGHT_SHIFT(tmp0 + MULTIPLY(tmp10, FIX_0_765366865), /* c2-c6 */
		  CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*3] = (DCTELEM)
      RIGHT_SHIFT(tmp0 - MULTIPLY(tmp11, FIX_1_847759065), /* c2+c6 */
		  CONST_BITS+PASS1_BITS);

    dataptr++;			/* advance pointer to next column */
  }
}